

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

void __thiscall Assimp::STEP::SyntaxError::SyntaxError(SyntaxError *this,string *s,uint64_t line)

{
  allocator<char> local_61;
  string local_60;
  string local_40;
  uint64_t local_20;
  uint64_t line_local;
  string *s_local;
  SyntaxError *this_local;
  
  local_20 = line;
  line_local = (uint64_t)s;
  s_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  AddLineNumber(&local_40,s,line,&local_60);
  DeadlyImportError::DeadlyImportError(&this->super_DeadlyImportError,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  *(undefined ***)&this->super_DeadlyImportError = &PTR__SyntaxError_01019348;
  return;
}

Assistant:

STEP::SyntaxError::SyntaxError (const std::string& s,uint64_t line /* = LINE_NOT_SPECIFIED */)
: DeadlyImportError(AddLineNumber(s,line))
{

}